

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86_fma::forwardDilation_x86
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  Option opt_g;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  size_t elemsize;
  int h;
  int w;
  Mat *m_3;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff850;
  void **ppvVar1;
  size_t in_stack_fffffffffffff858;
  long in_stack_fffffffffffff860;
  undefined8 *in_stack_fffffffffffff868;
  Mat *in_stack_fffffffffffff870;
  bool local_6d2;
  bool local_6c1;
  bool local_69d;
  int local_69c;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined4 local_680;
  long *local_678;
  undefined4 local_670;
  undefined4 local_66c;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined8 local_658;
  long local_650;
  int local_644;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined4 local_628;
  long local_620;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined8 local_600;
  long local_5f8;
  int local_5ec;
  undefined8 local_5e8;
  long *plStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  int local_59c;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined4 local_580;
  long local_578;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined8 local_558;
  long local_550;
  int local_544;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined4 local_528;
  long *local_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined8 local_500;
  void *local_4f8;
  int local_4ec;
  undefined4 local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  void *local_4c0;
  int *local_4b8;
  long local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  undefined4 local_498;
  int local_494;
  int local_490;
  undefined4 local_48c;
  int local_488;
  long local_480;
  void *local_478;
  int *local_470;
  long local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  int local_448;
  undefined4 local_444;
  int local_440;
  long local_438;
  int local_430;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  long local_418;
  int local_410;
  int local_40c;
  undefined8 *local_408;
  long *local_400;
  long *local_3f8;
  int local_3e4;
  void **local_3e0;
  void **local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c0;
  undefined8 *local_3b0;
  undefined8 *local_3a0;
  void **local_390;
  void **local_380;
  int local_360;
  undefined4 local_35c;
  void **local_358;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  undefined8 *local_318;
  undefined8 *local_2f8;
  undefined8 *local_2d8;
  undefined8 *local_2b8;
  void **local_2b0;
  void **local_2a8;
  long *local_2a0;
  undefined1 local_295;
  int local_294;
  void **local_290;
  undefined8 *local_288;
  undefined1 local_265;
  int local_264;
  undefined8 *local_258;
  undefined1 local_235;
  int local_234;
  void **local_230;
  undefined8 *local_228;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined1 local_1ed;
  int local_1ec;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  void *local_158;
  void *local_148;
  long *local_138;
  void **local_130;
  void **local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long *local_e8;
  undefined4 local_dc;
  long local_d8;
  void *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  long local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  undefined4 local_6c;
  long local_68;
  Mat *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_40c = *(int *)((long)in_RSI + 0x2c);
  local_410 = (int)in_RSI[6];
  local_418 = in_RSI[2];
  local_41c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  local_420 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
  local_424 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
  local_428 = local_424 * (local_41c + -1) + 1;
  local_42c = (local_40c - local_428) / local_420 + 1;
  local_430 = (local_410 - local_428) / local_420 + 1;
  local_408 = in_RCX;
  local_400 = in_RDX;
  local_3f8 = in_RSI;
  Mat::create(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20),
              (int)in_stack_fffffffffffff868,(int)((ulong)in_stack_fffffffffffff860 >> 0x20),
              in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  local_2a0 = local_400;
  local_69d = true;
  if (*local_400 != 0) {
    local_138 = local_400;
    local_69d = local_400[8] * (long)(int)local_400[7] == 0;
  }
  if (local_69d) {
    local_3e4 = -100;
  }
  else {
    local_3e0 = &local_478;
    local_478 = (void *)0x0;
    local_470 = (int *)0x0;
    local_468 = 0;
    local_460 = 0;
    local_458 = (long *)0x0;
    local_450 = 0;
    local_44c = 0;
    local_448 = 0;
    local_444 = 0;
    local_440 = 0;
    local_438 = 0;
    local_3d8 = &local_4c0;
    local_4c0 = (void *)0x0;
    local_4b8 = (int *)0x0;
    local_4b0 = 0;
    local_4a8 = 0;
    local_4a0 = (long *)0x0;
    local_498 = 0;
    local_494 = 0;
    local_490 = 0;
    local_48c = 0;
    local_488 = 0;
    local_480 = 0;
    for (local_4d0 = 0; local_4d0 < local_424; local_4d0 = local_4d0 + 1) {
      for (local_4d4 = 0; local_4d4 < local_424; local_4d4 = local_4d4 + 1) {
        local_4d8 = ((local_40c - local_4d4) + -1 + local_424) / local_424;
        local_4dc = ((local_410 - local_4d0) + -1 + local_424) / local_424;
        local_4e0 = (local_4d8 - local_41c) / local_420 + 1;
        local_4e4 = (local_4dc - local_41c) / local_420 + 1;
        Mat::create(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                    (int)in_stack_fffffffffffff868,(int)((ulong)in_stack_fffffffffffff860 >> 0x20),
                    in_stack_fffffffffffff858,in_stack_fffffffffffff850);
        local_2a8 = &local_478;
        if (local_478 != (void *)0x0) {
          local_130 = local_2a8;
        }
        local_6c1 = local_478 == (void *)0x0 || local_438 * local_440 == 0;
        if (local_6c1) {
          local_3e4 = -100;
          goto LAB_005f5be8;
        }
        Mat::create(in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                    (int)in_stack_fffffffffffff868,(int)((ulong)in_stack_fffffffffffff860 >> 0x20),
                    in_stack_fffffffffffff858,in_stack_fffffffffffff850);
        local_2b0 = &local_4c0;
        if (local_4c0 != (void *)0x0) {
          local_128 = local_2b0;
        }
        local_6d2 = local_4c0 == (void *)0x0 || local_480 * local_488 == 0;
        if (local_6d2) {
          local_3e4 = -100;
          goto LAB_005f5be8;
        }
        for (local_4ec = 0; local_4ec < (int)local_3f8[7]; local_4ec = local_4ec + 1) {
          local_228 = &local_540;
          local_230 = &local_478;
          local_d0 = (void *)((long)local_478 + local_438 * local_4ec * local_468);
          local_b8 = &local_540;
          local_18 = (long)local_44c * (long)local_448 * local_468;
          local_200 = &local_540;
          local_3d0 = &local_540;
          local_520 = local_458;
          local_1c = 0x10;
          local_bc = local_44c;
          local_c0 = local_448;
          local_c4 = local_444;
          local_d8 = local_468;
          local_dc = local_460;
          local_e8 = local_458;
          local_234 = local_4ec;
          local_235 = 1;
          local_540 = 0;
          local_530 = 0;
          local_528 = 0;
          local_518 = 0;
          local_514 = 0;
          local_510 = 0;
          local_50c = 0;
          local_508 = 0;
          local_500 = 0;
          local_538 = 0;
          local_4f8 = local_d0;
          for (local_544 = 0; local_544 < local_4dc; local_544 = local_544 + 1) {
            local_1e0 = &local_598;
            local_f4 = *(int *)((long)local_3f8 + 0x2c);
            local_f8 = (int)local_3f8[6];
            local_fc = *(undefined4 *)((long)local_3f8 + 0x34);
            local_108 = *local_3f8 + local_3f8[8] * (long)local_4ec * local_3f8[2];
            local_110 = local_3f8[2];
            local_114 = (undefined4)local_3f8[3];
            local_120 = local_3f8[4];
            local_f0 = &local_598;
            local_8 = (long)local_f4 * (long)local_f8 * local_110;
            local_1f8 = &local_598;
            local_550 = local_108 + (long)(local_424 * local_544 * local_40c) * 4 +
                        (long)(local_4d0 * local_40c) * 4 + (long)local_4d4 * 4;
            local_3c0 = &local_598;
            local_c = 0x10;
            local_1ec = local_4ec;
            local_1ed = 1;
            local_598 = 0;
            local_588 = 0;
            local_580 = 0;
            local_570 = 0;
            local_56c = 0;
            local_568 = 0;
            local_564 = 0;
            local_560 = 0;
            local_558 = 0;
            local_590 = 0;
            for (local_59c = 0; local_59c < local_4d8; local_59c = local_59c + 1) {
              *(undefined4 *)((long)local_4f8 + (long)local_59c * 4) =
                   *(undefined4 *)(local_550 + (long)(local_59c * local_424) * 4);
            }
            local_4f8 = (void *)((long)local_4f8 + (long)local_4d8 * 4);
            local_2d8 = local_3c0;
            local_578 = local_120;
          }
          local_2b8 = local_3d0;
        }
        local_5e8 = *local_408;
        uStack_5d8 = local_408[2];
        uStack_5d0 = local_408[3];
        local_5c8 = local_408[4];
        uStack_5c0 = local_408[5];
        uStack_5b8 = local_408[6];
        uStack_5b0 = local_408[7];
        plStack_5e0 = local_4a0;
        (**(code **)(*(long *)in_RDI[0x2f] + 0x38))
                  ((long *)in_RDI[0x2f],&local_478,&local_4c0,&local_5e8);
        for (local_5ec = 0; local_5ec < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_5ec = local_5ec + 1) {
          local_258 = &local_640;
          local_84 = *(int *)((long)local_400 + 0x2c);
          local_88 = (int)local_400[6];
          local_8c = *(undefined4 *)((long)local_400 + 0x34);
          local_98 = *local_400 + local_400[8] * (long)local_5ec * local_400[2];
          local_a0 = local_400[2];
          local_a4 = (undefined4)local_400[3];
          local_b0 = local_400[4];
          local_80 = &local_640;
          local_28 = (long)local_84 * (long)local_88 * local_a0;
          local_208 = &local_640;
          local_5f8 = local_98 + (long)(local_4d0 * local_42c) * 4 + (long)local_4d4 * 4;
          local_3b0 = &local_640;
          local_2c = 0x10;
          local_264 = local_5ec;
          local_265 = 1;
          local_640 = 0;
          local_630 = 0;
          local_628 = 0;
          local_618 = 0;
          local_614 = 0;
          local_610 = 0;
          local_60c = 0;
          local_608 = 0;
          local_600 = 0;
          local_638 = 0;
          for (local_644 = 0; local_644 < local_4e4; local_644 = local_644 + 1) {
            local_288 = &local_698;
            local_290 = &local_4c0;
            in_stack_fffffffffffff870 = (Mat *)((long)local_4c0 + local_480 * local_5ec * local_4b0)
            ;
            local_48 = &local_698;
            local_38 = (long)local_494 * (long)local_490 * local_4b0;
            local_1c0 = &local_698;
            in_stack_fffffffffffff860 =
                 (long)&in_stack_fffffffffffff870->data + (long)(local_644 * local_4e0) * 4;
            in_stack_fffffffffffff868 = &local_698;
            local_678 = local_4a0;
            local_3c = 0x10;
            local_4c = local_494;
            local_50 = local_490;
            local_54 = local_48c;
            local_68 = local_4b0;
            local_6c = local_4a8;
            local_294 = local_5ec;
            local_295 = 1;
            local_698 = 0;
            local_688 = 0;
            local_680 = 0;
            local_670 = 0;
            local_66c = 0;
            local_668 = 0;
            local_664 = 0;
            local_660 = 0;
            local_658 = 0;
            local_690 = 0;
            for (local_69c = 0; local_69c < local_4e0; local_69c = local_69c + 1) {
              *(undefined4 *)(local_5f8 + (long)(local_69c * local_424) * 4) =
                   *(undefined4 *)(in_stack_fffffffffffff860 + (long)local_69c * 4);
            }
            local_5f8 = local_5f8 + (long)(local_424 * local_42c) * 4;
            local_650 = in_stack_fffffffffffff860;
            local_3a0 = in_stack_fffffffffffff868;
            local_318 = in_stack_fffffffffffff868;
            local_60 = in_stack_fffffffffffff870;
          }
          local_2f8 = local_3b0;
          local_620 = local_b0;
        }
      }
    }
    if (in_RDI[1] != 0) {
      (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_400,local_408);
    }
    local_3e4 = 0;
LAB_005f5be8:
    local_4e8 = 1;
    ppvVar1 = &local_4c0;
    local_390 = ppvVar1;
    local_338 = ppvVar1;
    if (local_4b8 != (int *)0x0) {
      local_33c = 0xffffffff;
      LOCK();
      local_340 = *local_4b8;
      *local_4b8 = *local_4b8 + -1;
      UNLOCK();
      if (local_340 == 1) {
        if (local_4a0 == (long *)0x0) {
          local_158 = local_4c0;
          if (local_4c0 != (void *)0x0) {
            free(local_4c0);
          }
        }
        else {
          (**(code **)(*local_4a0 + 0x18))(local_4a0,local_4c0);
        }
      }
    }
    *ppvVar1 = (void *)0x0;
    ppvVar1[2] = (void *)0x0;
    *(undefined4 *)(ppvVar1 + 3) = 0;
    *(undefined4 *)(ppvVar1 + 5) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
    *(undefined4 *)(ppvVar1 + 6) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
    *(undefined4 *)(ppvVar1 + 7) = 0;
    ppvVar1[8] = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
    ppvVar1 = &local_478;
    if (local_470 != (int *)0x0) {
      local_35c = 0xffffffff;
      LOCK();
      local_360 = *local_470;
      *local_470 = *local_470 + -1;
      UNLOCK();
      if (local_360 == 1) {
        local_380 = ppvVar1;
        local_358 = ppvVar1;
        if (local_458 == (long *)0x0) {
          local_148 = local_478;
          if (local_478 != (void *)0x0) {
            free(local_478);
          }
        }
        else {
          (**(code **)(*local_458 + 0x18))(local_458,local_478);
        }
      }
    }
    *ppvVar1 = (void *)0x0;
    ppvVar1[2] = (void *)0x0;
    *(undefined4 *)(ppvVar1 + 3) = 0;
    *(undefined4 *)(ppvVar1 + 5) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
    *(undefined4 *)(ppvVar1 + 6) = 0;
    *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
    *(undefined4 *)(ppvVar1 + 7) = 0;
    ppvVar1[8] = (void *)0x0;
    ppvVar1[1] = (void *)0x0;
  }
  return local_3e4;
}

Assistant:

int Convolution_x86_fma::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}